

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O3

CURLcode Curl_retry_request(connectdata *conn,char **url)

{
  undefined1 *puVar1;
  Curl_easy *pCVar2;
  uint uVar3;
  CURLcode CVar4;
  char *pcVar5;
  CURLcode CVar6;
  
  pCVar2 = conn->data;
  *url = (char *)0x0;
  uVar3 = (uint)*(undefined8 *)&(pCVar2->set).field_0x8e8;
  if (((uVar3 >> 0x1d & 1) == 0) || ((conn->handler->protocol & 0x40003) != 0)) {
    CVar6 = CURLE_OK;
    if ((pCVar2->req).bytecount + (pCVar2->req).headerbytecount == 0) {
      if ((((conn->bits).field_0x4 & 2) == 0) ||
         ((((uVar3 >> 0x1c & 1) != 0 && ((conn->handler->protocol & 3) == 0)) ||
          ((pCVar2->set).rtspreq == RTSPREQ_RECEIVE)))) {
        if (((pCVar2->state).field_0x514 & 4) == 0) {
          return CURLE_OK;
        }
        Curl_infof(conn->data,"REFUSED_STREAM, retrying a fresh connect\n");
        puVar1 = &(pCVar2->state).field_0x514;
        *puVar1 = *puVar1 & 0xfb;
      }
      CVar6 = CURLE_OK;
      Curl_infof(conn->data,"Connection died, retrying a fresh connect\n");
      pcVar5 = (*Curl_cstrdup)((conn->data->change).url);
      *url = pcVar5;
      if (pcVar5 == (char *)0x0) {
        CVar6 = CURLE_OUT_OF_MEMORY;
      }
      else {
        Curl_conncontrol(conn,1);
        puVar1 = &(conn->bits).field_0x5;
        *puVar1 = *puVar1 | 0x40;
        if ((((conn->handler->protocol & 3) != 0) && ((pCVar2->req).writebytecount != 0)) &&
           (CVar4 = Curl_readrewind(conn), CVar4 != CURLE_OK)) {
          (*Curl_cfree)(*url);
          *url = (char *)0x0;
          CVar6 = CVar4;
        }
      }
    }
  }
  else {
    CVar6 = CURLE_OK;
  }
  return CVar6;
}

Assistant:

CURLcode Curl_retry_request(struct connectdata *conn,
                            char **url)
{
  struct Curl_easy *data = conn->data;
  bool retry = FALSE;
  *url = NULL;

  /* if we're talking upload, we can't do the checks below, unless the protocol
     is HTTP as when uploading over HTTP we will still get a response */
  if(data->set.upload &&
     !(conn->handler->protocol&(PROTO_FAMILY_HTTP|CURLPROTO_RTSP)))
    return CURLE_OK;

  if((data->req.bytecount + data->req.headerbytecount == 0) &&
      conn->bits.reuse &&
      (!data->set.opt_no_body
        || (conn->handler->protocol & PROTO_FAMILY_HTTP)) &&
      (data->set.rtspreq != RTSPREQ_RECEIVE))
    /* We got no data, we attempted to re-use a connection. For HTTP this
       can be a retry so we try again regardless if we expected a body.
       For other protocols we only try again only if we expected a body.

       This might happen if the connection was left alive when we were
       done using it before, but that was closed when we wanted to read from
       it again. Bad luck. Retry the same request on a fresh connect! */
    retry = TRUE;
  else if(data->state.refused_stream &&
          (data->req.bytecount + data->req.headerbytecount == 0) ) {
    /* This was sent on a refused stream, safe to rerun. A refused stream
       error can typically only happen on HTTP/2 level if the stream is safe
       to issue again, but the nghttp2 API can deliver the message to other
       streams as well, which is why this adds the check the data counters
       too. */
    infof(conn->data, "REFUSED_STREAM, retrying a fresh connect\n");
    data->state.refused_stream = FALSE; /* clear again */
    retry = TRUE;
  }
  if(retry) {
    infof(conn->data, "Connection died, retrying a fresh connect\n");
    *url = strdup(conn->data->change.url);
    if(!*url)
      return CURLE_OUT_OF_MEMORY;

    connclose(conn, "retry"); /* close this connection */
    conn->bits.retry = TRUE; /* mark this as a connection we're about
                                to retry. Marking it this way should
                                prevent i.e HTTP transfers to return
                                error just because nothing has been
                                transferred! */


    if(conn->handler->protocol&PROTO_FAMILY_HTTP) {
      if(data->req.writebytecount) {
        CURLcode result = Curl_readrewind(conn);
        if(result) {
          Curl_safefree(*url);
          return result;
        }
      }
    }
  }
  return CURLE_OK;
}